

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O1

void CGTFS_FileUtils(void)

{
  ulong uVar1;
  FILE *pFVar2;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *pFVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  char **record_values;
  char **field_names;
  char **local_58;
  char **local_50;
  byte local_41;
  int local_40;
  int local_3c;
  FILE *local_38;
  
  iVar4 = greatest_test_pre("file_utils_read_header_0");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/agency.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0xe;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
      }
      else {
        uVar5 = read_header((FILE *)pFVar7,&local_50);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar5 == 6) {
          lVar8 = 0;
          do {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001f1134 +
                                       (long)*(int *)((long)&DAT_001f1134 + lVar8)),
                               *(void **)((long)local_50 + lVar8 * 2),&greatest_type_info_string,
                               (void *)0x0);
            ppcVar3 = local_50;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x21;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                greatest_info.msg = "type_info->equal callback missing!";
              }
              else {
                greatest_info.msg = "correct_field_names[i] != field_names[i]";
              }
              goto joined_r0x0011de9c;
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x18);
          if (local_50 != (char **)0x0) {
            lVar8 = 0;
            do {
              free(ppcVar3[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 6);
            free(ppcVar3);
          }
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011df90;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",6);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1e;
        greatest_info.msg = "Counted wrong number of fields in the header";
      }
joined_r0x0011de9c:
      iVar4 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011df90:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_header_1");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/routes.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0x2d;
        greatest_info.msg = "Couldn\'t open `data/routes.txt` test file";
      }
      else {
        uVar5 = read_header((FILE *)pFVar7,&local_50);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar5 == 7) {
          lVar8 = 0;
          do {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t
                              ((void *)((long)&DAT_001f114c +
                                       (long)*(int *)((long)&DAT_001f114c + lVar8)),
                               *(void **)((long)local_50 + lVar8 * 2),&greatest_type_info_string,
                               (void *)0x0);
            ppcVar3 = local_50;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x41;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                greatest_info.msg = "type_info->equal callback missing!";
              }
              else {
                greatest_info.msg = "correct_field_names[i] != field_names[i]";
              }
              goto joined_r0x0011e0bd;
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x1c);
          if (local_50 != (char **)0x0) {
            lVar8 = 0;
            do {
              free(ppcVar3[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 7);
            free(ppcVar3);
          }
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011e1b1;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",7);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x3e;
        greatest_info.msg = "Counted wrong number of fields in the header";
      }
joined_r0x0011e0bd:
      iVar4 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011e1b1:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_header_2_empty");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/empty.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0x4c;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        local_50 = (char **)0x0;
        uVar5 = read_header((FILE *)pFVar7,&local_50);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar5 == 0xffffffff) {
          if (local_50 != (char **)0x0) {
            free(local_50);
          }
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011e337;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x52;
        greatest_info.msg = "Counted some fields in an empty header";
      }
      iVar4 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011e337:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_header_3_badfile");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/doesntexist.txt","r");
      uVar5 = read_header((FILE *)pFVar7,&local_50);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar5 == 0xffffffff) {
        if (local_50 != (char **)0x0) {
          free(local_50);
        }
        if (pFVar7 != (FILE *)0x0) {
          fclose(pFVar7);
        }
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "Somehow opened the file that doesn\'t exist";
        iVar4 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
      }
    }
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_record_0");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/agency.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0x72;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
joined_r0x0011e8fc:
        iVar4 = -1;
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
      }
      else {
        iVar4 = read_header((FILE *)pFVar7,&local_50);
        local_38 = pFVar7;
        iVar6 = read_record((FILE *)pFVar7,iVar4,&local_58);
        lVar8 = (long)iVar4;
        local_40 = iVar4;
        if (0 < iVar6) {
          iVar6 = 0;
          local_3c = iVar4;
LAB_0011e513:
          if (iVar6 == 3) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("4",*local_58,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x8d;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"4\" != record_values[0]";
                goto joined_r0x0011e8fc;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                (anon_var_dwarf_1f1e,local_58[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar4 == 0) {
                greatest_info.fail_line = 0x8e;
                if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                  greatest_info.msg = anon_var_dwarf_1f29;
                  goto joined_r0x0011e8fc;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_58[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x8f;
joined_r0x0011eaac:
                  if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                    greatest_info.msg = "\"http://www.lsl.fi\" != record_values[2]";
                    goto joined_r0x0011e8fc;
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("blah \"HELLO\" blah",local_58[3],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x90;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"blah \\\"HELLO\\\" blah\" != record_values[3]";
                      goto joined_r0x0011e8fc;
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("fi",local_58[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 == 0) {
                      greatest_info.fail_line = 0x91;
joined_r0x0011ebcd:
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                        greatest_info.msg = "\"fi\" != record_values[4]";
                        goto joined_r0x0011e8fc;
                      }
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar4 = greatest_do_assert_equal_t
                                        ("03 814 2355",local_58[5],&greatest_type_info_string,
                                         (void *)0x0);
                      if (iVar4 != 0) goto LAB_0011e7f0;
                      greatest_info.fail_line = 0x92;
joined_r0x0011ec52:
                      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                        greatest_info.msg = "\"03 814 2355\" != record_values[5]";
                        goto joined_r0x0011e8fc;
                      }
                    }
                  }
                }
              }
            }
          }
          else if (iVar6 == 2) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("3",*local_58,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x85;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"3\" != record_values[0]";
                goto joined_r0x0011e8fc;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                ("",local_58[1],&greatest_type_info_string,(void *)0x0);
              if (iVar4 == 0) {
                greatest_info.fail_line = 0x86;
                if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                  greatest_info.msg = anon_var_dwarf_1f29 + 0x20;
                  goto joined_r0x0011e8fc;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("",local_58[2],&greatest_type_info_string,(void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x87;
                  if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                    greatest_info.msg = "\"\" != record_values[2]";
                    goto joined_r0x0011e8fc;
                  }
                }
                else {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("",local_58[3],&greatest_type_info_string,(void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x88;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"\" != record_values[3]";
                      goto joined_r0x0011e8fc;
                    }
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("",local_58[4],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 == 0) {
                      greatest_info.fail_line = 0x89;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_0011ec54;
                      greatest_info.msg = "\"\" != record_values[4]";
                      goto joined_r0x0011e8fc;
                    }
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar4 = greatest_do_assert_equal_t
                                      ("",local_58[5],&greatest_type_info_string,(void *)0x0);
                    if (iVar4 != 0) goto LAB_0011e7f0;
                    greatest_info.fail_line = 0x8a;
                    if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                      greatest_info.msg = "\"\" != record_values[5]";
                      goto joined_r0x0011e8fc;
                    }
                  }
                }
              }
            }
          }
          else {
            if (iVar6 != 0) {
LAB_0011e7f0:
              ppcVar3 = local_58;
              if (local_58 != (char **)0x0) {
                lVar9 = 0;
                if (0 < local_40) {
                  do {
                    free(ppcVar3[lVar9]);
                    lVar9 = lVar9 + 1;
                  } while (lVar8 != lVar9);
                }
                free(ppcVar3);
              }
              iVar6 = iVar6 + 1;
              iVar4 = read_record((FILE *)local_38,local_3c,&local_58);
              if (iVar4 < 1) goto LAB_0011e84b;
              goto LAB_0011e513;
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar4 = greatest_do_assert_equal_t("1",*local_58,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar4 == 0) {
              greatest_info.fail_line = 0x7d;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"1\" != record_values[0]";
                goto joined_r0x0011e8fc;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar4 = greatest_do_assert_equal_t
                                ("Lahden Seudun Liikenne",local_58[1],&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar4 != 0) {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("http://www.lsl.fi",local_58[2],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar4 == 0) {
                  greatest_info.fail_line = 0x7f;
                  goto joined_r0x0011eaac;
                }
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar4 = greatest_do_assert_equal_t
                                  ("Europe/Helsinki",local_58[3],&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar4 != 0) {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("fi",local_58[4],&greatest_type_info_string,(void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x81;
                    goto joined_r0x0011ebcd;
                  }
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar4 = greatest_do_assert_equal_t
                                    ("03 814 2355",local_58[5],&greatest_type_info_string,
                                     (void *)0x0);
                  if (iVar4 == 0) {
                    greatest_info.fail_line = 0x82;
                    goto joined_r0x0011ec52;
                  }
                  goto LAB_0011e7f0;
                }
                greatest_info.fail_line = 0x80;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011ec54;
                greatest_info.msg = "\"Europe/Helsinki\" != record_values[3]";
                goto joined_r0x0011e8fc;
              }
              greatest_info.fail_line = 0x7e;
              if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) {
                greatest_info.msg = "\"Lahden Seudun Liikenne\" != record_values[1]";
                goto joined_r0x0011e8fc;
              }
            }
          }
LAB_0011ec54:
          greatest_info.msg = "type_info->equal callback missing!";
          goto joined_r0x0011e8fc;
        }
LAB_0011e84b:
        ppcVar3 = local_50;
        if (local_50 != (char **)0x0) {
          if (0 < local_40) {
            lVar9 = 0;
            do {
              free(ppcVar3[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
          }
          free(ppcVar3);
        }
        ppcVar3 = local_58;
        if (local_58 != (char **)0x0) {
          if (0 < local_40) {
            lVar9 = 0;
            do {
              free(ppcVar3[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
          }
          free(ppcVar3);
        }
        fclose(local_38);
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
    }
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_record_1_empty");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/empty.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        uVar5 = read_header((FILE *)pFVar7,&local_50);
        if (uVar5 == 0xffffffff) {
          greatest_info.assertions = greatest_info.assertions + 2;
          iVar4 = read_record((FILE *)pFVar7,-1,&local_58);
          if (iVar4 == -1) {
            if (local_50 != (char **)0x0) {
              free(local_50);
            }
            if (local_58 != (char **)0x0) {
              free(local_58);
            }
            fclose(pFVar7);
            greatest_info.msg = (char *)0x0;
            iVar4 = 0;
            goto LAB_0011eef8;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          pFVar2 = _stdout;
          uVar5 = read_record((FILE *)pFVar7,-1,&local_58);
          fprintf(pFVar2,"%i",(ulong)uVar5);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xae;
          greatest_info.msg = "Somehow read a record that doesn\'t exist";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xffffffff);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar5);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xab;
          greatest_info.msg = "Somehow read the header of an empty file";
        }
      }
      iVar4 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011eef8:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_read_record_2_badfile");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/doesntexist.txt","r");
      uVar5 = read_header((FILE *)pFVar7,&local_50);
      if (uVar5 == 0xffffffff) {
        greatest_info.assertions = greatest_info.assertions + 2;
        iVar4 = read_record((FILE *)pFVar7,-1,&local_58);
        if (iVar4 == -1) {
          if (local_50 != (char **)0x0) {
            free(local_50);
          }
          if (local_58 != (char **)0x0) {
            free(local_58);
          }
          if (pFVar7 != (FILE *)0x0) {
            fclose(pFVar7);
          }
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011f13c;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        pFVar2 = _stdout;
        uVar5 = read_record((FILE *)pFVar7,-1,&local_58);
        fprintf(pFVar2,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xc1;
        greatest_info.msg = "Somehow read a record from a file that doesn\'t exist";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_line = 0xbe;
        greatest_info.msg = "Somehow read the header of a nonexisting file";
      }
      iVar4 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011f13c:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_count_lines_0");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/agency.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0xd4;
        greatest_info.msg = "Couldn\'t open `data/agency.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar4 = count_lines((FILE *)pFVar7);
        if (iVar4 == 5) {
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011f209;
        }
        greatest_info.fail_line = 0xd6;
        greatest_info.msg = "5 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar4 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011f209:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_count_lines_1");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/empty.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0xdf;
        greatest_info.msg = "Couldn\'t open `data/empty.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar4 = count_lines((FILE *)pFVar7);
        if (iVar4 == 0) {
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011f2d4;
        }
        greatest_info.fail_line = 0xe1;
        greatest_info.msg = "0 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar4 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011f2d4:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_count_lines_2");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/only_nl.txt","r");
      if (pFVar7 == (FILE *)0x0) {
        greatest_info.fail_line = 0xea;
        greatest_info.msg = "Couldn\'t open `data/only_nl.txt` test file";
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar4 = count_lines((FILE *)pFVar7);
        if (iVar4 == 2) {
          fclose(pFVar7);
          greatest_info.msg = (char *)0x0;
          iVar4 = 0;
          goto LAB_0011f3a1;
        }
        greatest_info.fail_line = 0xec;
        greatest_info.msg = "2 != count_lines(fp)";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      iVar4 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
    }
LAB_0011f3a1:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_count_lines_3_badfile");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      pFVar7 = fopen("../tests/data/doesntexist.txt","r");
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar4 = count_lines((FILE *)pFVar7);
      if (iVar4 == -1) {
        if (pFVar7 != (FILE *)0x0) {
          fclose(pFVar7);
        }
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0xf4;
        greatest_info.msg = "-1 != count_lines(fp)";
        iVar4 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
      }
    }
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_list_files_1");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      uVar5 = list_txt_files("../tests/data/google_sample",&local_50);
      ppcVar3 = local_50;
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar5 == 0xb) {
        uVar10 = 0;
        bVar11 = false;
        do {
          local_41 = bVar11;
          iVar4 = (&DAT_001f1168)[uVar10];
          lVar9 = 0;
          lVar8 = lVar9;
          do {
            iVar6 = strcmp(ppcVar3[lVar9],(char *)((long)&DAT_001f1168 + (long)iVar4));
            if (iVar6 == 0) {
              lVar8 = 1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xb);
          if ((int)lVar8 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
            ;
            greatest_info.fail_line = 0x117;
            greatest_info.msg = "An expected filename not found in the result array";
            if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
            iVar4 = -1;
            if ((local_41 & 1) == 0) goto LAB_0011f62a;
            break;
          }
          uVar1 = uVar10 + 1;
          bVar11 = 9 < uVar10;
          uVar10 = uVar1;
        } while (uVar1 != 0xb);
        if (ppcVar3 != (char **)0x0) {
          lVar8 = 0;
          do {
            free(ppcVar3[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0xb);
          free(ppcVar3);
        }
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xb);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x10f;
        greatest_info.msg = "CGTFS_FILE_UTILS_LIST_1_SIZE != file_count";
        iVar4 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
      }
    }
LAB_0011f62a:
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_list_files_2_nofiles");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      uVar5 = list_txt_files("../tests/data/no_txt_files_dir",&local_50);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar5 == 0) {
        if (local_50 != (char **)0x0) {
          free(local_50);
        }
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x123;
        greatest_info.msg = "0 != file_count";
        iVar4 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011f847;
      }
    }
    greatest_test_post(iVar4);
  }
  iVar4 = greatest_test_pre("file_utils_list_files_3_nodir");
  if (iVar4 != 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      uVar5 = list_txt_files("../tests/data/dir_not_found",&local_50);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar5 == 0xffffffff) {
        greatest_info.msg = (char *)0x0;
        iVar4 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar5);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
        ;
        greatest_info.fail_line = 0x12d;
        greatest_info.msg = "-1 != file_count";
        iVar4 = -1;
        if ((greatest_info.flags & 4) != 0) {
LAB_0011f847:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
          ;
          abort();
        }
      }
    }
    greatest_test_post(iVar4);
  }
  return;
}

Assistant:

SUITE(CGTFS_FileUtils) {
    RUN_TEST(file_utils_read_header_0);
    RUN_TEST(file_utils_read_header_1);
    RUN_TEST(file_utils_read_header_2_empty);
    RUN_TEST(file_utils_read_header_3_badfile);

    RUN_TEST(file_utils_read_record_0);
    RUN_TEST(file_utils_read_record_1_empty);
    RUN_TEST(file_utils_read_record_2_badfile);

    RUN_TEST(file_utils_count_lines_0);
    RUN_TEST(file_utils_count_lines_1);
    RUN_TEST(file_utils_count_lines_2);
    RUN_TEST(file_utils_count_lines_3_badfile);

    RUN_TEST(file_utils_list_files_1);
    RUN_TEST(file_utils_list_files_2_nofiles);
    RUN_TEST(file_utils_list_files_3_nodir);
}